

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<-19>,_Detail::M3<-14>,_Detail::M3<-11>,_Detail::M3<-7>,_Detail::M3<-13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<_19>,_Detail::M3<_14>,_Detail::M3<_11>,_Detail::M3<_7>,_Detail::M3<_13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
           *this)

{
  int local_b0;
  result_type local_ac;
  int iterations;
  result_type x;
  uint *p;
  uint local_98 [2];
  uint state [32];
  WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<_19>,_Detail::M3<_14>,_Detail::M3<_11>,_Detail::M3<_7>,_Detail::M3<_13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
  *this_local;
  
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_98,0x20,(int *)((long)&p + 4));
  _iterations = local_98;
  Well<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,Detail::M1,Detail::M3<8>,Detail::M3<-19>,Detail::M3<-14>,Detail::M3<-11>,Detail::M3<-7>,Detail::M3<-13>,Detail::M0,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,Detail::M1,Detail::M3<8>,Detail::M3<_19>,Detail::M3<_14>,Detail::M3<_11>,Detail::M3<_7>,Detail::M3<_13>,Detail::M0,Detail::NoTempering>
              *)this,(uint **)&iterations,state + 0x1e);
  local_ac = 0;
  local_b0 = 1000000000;
  while (0 < local_b0) {
    local_ac = Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<-19>,_Detail::M3<-14>,_Detail::M3<-11>,_Detail::M3<-7>,_Detail::M3<-13>,_Detail::M0,_Detail::NoTempering>
               ::operator()(&this->rng);
    local_b0 = local_b0 + -1;
  }
  return local_ac;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }